

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_imgui.h
# Opt level: O0

void simgui_new_frame(simgui_frame_desc_t *desc)

{
  _Bool _Var1;
  ImGuiMouseCursor IVar2;
  ImGuiIO *pIVar3;
  float local_24;
  sapp_mouse_cursor local_20;
  sapp_mouse_cursor cursor;
  ImGuiMouseCursor imgui_cursor;
  ImGuiIO *io;
  simgui_frame_desc_t *desc_local;
  
  if (desc == (simgui_frame_desc_t *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/util/sokol_imgui.h"
                  ,0x799,"void simgui_new_frame(const simgui_frame_desc_t *)");
  }
  if (desc->width < 1) {
    __assert_fail("desc->width > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/util/sokol_imgui.h"
                  ,0x79a,"void simgui_new_frame(const simgui_frame_desc_t *)");
  }
  if (desc->height < 1) {
    __assert_fail("desc->height > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/util/sokol_imgui.h"
                  ,0x79b,"void simgui_new_frame(const simgui_frame_desc_t *)");
  }
  if ((desc->dpi_scale != 0.0) || (NAN(desc->dpi_scale))) {
    local_24 = desc->dpi_scale;
  }
  else {
    local_24 = 1.0;
  }
  _simgui.cur_dpi_scale = local_24;
  pIVar3 = ImGui::GetIO();
  (pIVar3->DisplaySize).x = (float)desc->width / _simgui.cur_dpi_scale;
  (pIVar3->DisplaySize).y = (float)desc->height / _simgui.cur_dpi_scale;
  pIVar3->DeltaTime = (float)desc->delta_time;
  if (((pIVar3->WantTextInput & 1U) != 0) && (_Var1 = sapp_keyboard_shown(), !_Var1)) {
    sapp_show_keyboard(true);
  }
  if (((pIVar3->WantTextInput & 1U) == 0) && (_Var1 = sapp_keyboard_shown(), _Var1)) {
    sapp_show_keyboard(false);
  }
  if ((_simgui.desc.disable_set_mouse_cursor & 1U) == 0) {
    IVar2 = ImGui::GetMouseCursor();
    local_20 = sapp_get_mouse_cursor();
    switch(IVar2) {
    case 0:
      local_20 = SAPP_MOUSECURSOR_ARROW;
      break;
    case 1:
      local_20 = SAPP_MOUSECURSOR_IBEAM;
      break;
    case 2:
      local_20 = SAPP_MOUSECURSOR_RESIZE_ALL;
      break;
    case 3:
      local_20 = SAPP_MOUSECURSOR_RESIZE_NS;
      break;
    case 4:
      local_20 = SAPP_MOUSECURSOR_RESIZE_EW;
      break;
    case 5:
      local_20 = SAPP_MOUSECURSOR_RESIZE_NESW;
      break;
    case 6:
      local_20 = SAPP_MOUSECURSOR_RESIZE_NWSE;
      break;
    case 7:
      local_20 = SAPP_MOUSECURSOR_POINTING_HAND;
      break;
    case 8:
      local_20 = SAPP_MOUSECURSOR_NOT_ALLOWED;
    }
    sapp_set_mouse_cursor(local_20);
  }
  ImGui::NewFrame();
  return;
}

Assistant:

SOKOL_API_IMPL void simgui_new_frame(const simgui_frame_desc_t* desc) {
    SOKOL_ASSERT(desc);
    SOKOL_ASSERT(desc->width > 0);
    SOKOL_ASSERT(desc->height > 0);
    _simgui.cur_dpi_scale = _simgui_def(desc->dpi_scale, 1.0f);
    #if defined(__cplusplus)
        ImGuiIO* io = &ImGui::GetIO();
    #else
        ImGuiIO* io = igGetIO();
    #endif
    io->DisplaySize.x = ((float)desc->width) / _simgui.cur_dpi_scale;
    io->DisplaySize.y = ((float)desc->height) / _simgui.cur_dpi_scale;
    io->DeltaTime = (float)desc->delta_time;
    #if !defined(SOKOL_IMGUI_NO_SOKOL_APP)
        if (io->WantTextInput && !sapp_keyboard_shown()) {
            sapp_show_keyboard(true);
        }
        if (!io->WantTextInput && sapp_keyboard_shown()) {
            sapp_show_keyboard(false);
        }
        if (!_simgui.desc.disable_set_mouse_cursor) {
            #if defined(__cplusplus)
                ImGuiMouseCursor imgui_cursor = ImGui::GetMouseCursor();
            #else
                ImGuiMouseCursor imgui_cursor = igGetMouseCursor();
            #endif
            sapp_mouse_cursor cursor = sapp_get_mouse_cursor();
            switch (imgui_cursor) {
                case ImGuiMouseCursor_Arrow:        cursor = SAPP_MOUSECURSOR_ARROW; break;
                case ImGuiMouseCursor_TextInput:    cursor = SAPP_MOUSECURSOR_IBEAM; break;
                case ImGuiMouseCursor_ResizeAll:    cursor = SAPP_MOUSECURSOR_RESIZE_ALL; break;
                case ImGuiMouseCursor_ResizeNS:     cursor = SAPP_MOUSECURSOR_RESIZE_NS; break;
                case ImGuiMouseCursor_ResizeEW:     cursor = SAPP_MOUSECURSOR_RESIZE_EW; break;
                case ImGuiMouseCursor_ResizeNESW:   cursor = SAPP_MOUSECURSOR_RESIZE_NESW; break;
                case ImGuiMouseCursor_ResizeNWSE:   cursor = SAPP_MOUSECURSOR_RESIZE_NWSE; break;
                case ImGuiMouseCursor_Hand:         cursor = SAPP_MOUSECURSOR_POINTING_HAND; break;
                case ImGuiMouseCursor_NotAllowed:   cursor = SAPP_MOUSECURSOR_NOT_ALLOWED; break;
                default: break;
            }
            sapp_set_mouse_cursor(cursor);
        }
    #endif
    #if defined(__cplusplus)
        ImGui::NewFrame();
    #else
        igNewFrame();
    #endif
}